

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nvpair.c
# Opt level: O3

uchar * nvpair_unpack_binary(_Bool isbe,nvpair_t *nvp,uchar *ptr,size_t *leftp)

{
  ulong uVar1;
  size_t __size;
  void *__dest;
  int *piVar2;
  
  if (nvp->nvp_type != 7) {
    __assert_fail("nvp->nvp_type == 7",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Zer0-One[P]libnv-portable/src/nvpair.c"
                  ,0x35b,
                  "const unsigned char *nvpair_unpack_binary(_Bool, nvpair_t *, const unsigned char *, size_t *)"
                 );
  }
  uVar1 = *leftp;
  __size = nvp->nvp_datasize;
  if (__size - 1 < uVar1) {
    __dest = malloc(__size);
    if (__dest != (void *)0x0) {
      memcpy(__dest,ptr,__size);
      *leftp = uVar1 - __size;
      nvp->nvp_data = (uint64_t)__dest;
      return ptr + __size;
    }
  }
  else {
    piVar2 = __errno_location();
    *piVar2 = 0x16;
  }
  return (uchar *)0x0;
}

Assistant:

const unsigned char *
nvpair_unpack_binary(bool isbe __unused, nvpair_t *nvp,
    const unsigned char *ptr, size_t *leftp)
{
	void *value;

	PJDLOG_ASSERT(nvp->nvp_type == NV_TYPE_BINARY);

	if (*leftp < nvp->nvp_datasize || nvp->nvp_datasize == 0) {
		ERRNO_SET(EINVAL);
		return (NULL);
	}

	value = nv_malloc(nvp->nvp_datasize);
	if (value == NULL)
		return (NULL);

	memcpy(value, ptr, nvp->nvp_datasize);
	ptr += nvp->nvp_datasize;
	*leftp -= nvp->nvp_datasize;

	nvp->nvp_data = (uint64_t)(uintptr_t)value;

	return (ptr);
}